

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

void __thiscall duckdb_re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  int *piVar1;
  ostream *poVar2;
  _Head_base<0UL,_int_*,_false> _Var3;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  _Var4;
  uint *puVar5;
  IndexValue *pIVar6;
  Inst *pIVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  _Head_base<0UL,_int_*,_false> _Var12;
  SparseSet reachable;
  SparseSetT<void> local_1e0;
  IndexValue *local_1b8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  SparseSetT<void>::SparseSetT(&local_1e0,this->size_);
  fanout->size_ = 0;
  pIVar6 = (fanout->dense_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  if ((pIVar6 != (IndexValue *)0x0) &&
     (_Var4._M_head_impl.len_ = (Deleter)this->start_,
     (uint)_Var4._M_head_impl.len_ <
     (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                    super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
     )) {
    piVar1 = (fanout->sparse_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    piVar1[(int)_Var4._M_head_impl.len_] = 0;
    pIVar6->index_ = (int)_Var4._M_head_impl.len_;
    fanout->size_ = 1;
    pIVar6[piVar1[(int)_Var4._M_head_impl.len_]].value_ = 0;
    _Var3._M_head_impl =
         local_1e0.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
         _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    _Var12._M_head_impl =
         local_1e0.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
         _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    local_1b8 = pIVar6;
    do {
      local_1e0.size_ = 0;
      if (((uint *)_Var12._M_head_impl != (uint *)0x0) &&
         (uVar10 = local_1b8->index_,
         uVar10 < (uint)local_1e0.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                        super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                        super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>.
                        _M_head_impl.len_)) {
        local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar10] = 0;
        *_Var12._M_head_impl = uVar10;
        local_1e0.size_ = 1;
        puVar8 = (uint *)_Var12._M_head_impl + 1;
        uVar10 = *_Var12._M_head_impl;
        lVar11 = (long)(int)uVar10;
        pIVar7 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar9 = pIVar7[lVar11].out_opcode_;
        puVar5 = (uint *)_Var12._M_head_impl;
        switch(uVar9 & 7) {
        case 0:
          goto switchD_011d2f0c_caseD_0;
        case 1:
          goto switchD_011d2f0c_caseD_1;
        case 2:
          goto switchD_011d2f0c_caseD_2;
        default:
          goto switchD_011d2f0c_caseD_3;
        case 5:
          goto switchD_011d2f0c_caseD_5;
        case 7:
          goto switchD_011d2f0c_caseD_7;
        }
      }
LAB_011d3131:
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != pIVar6 + fanout->size_);
  }
  SparseSetT<void>::~SparseSetT(&local_1e0);
  return;
  do {
    uVar10 = *_Var12._M_head_impl;
    lVar11 = (long)(int)uVar10;
    pIVar7 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar9 = pIVar7[lVar11].out_opcode_;
    puVar5 = (uint *)_Var3._M_head_impl;
    switch(uVar9 & 7) {
    case 0:
switchD_011d2f0c_caseD_0:
      local_1b0 = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"unhandled ",10);
      poVar2 = (ostream *)std::ostream::operator<<(local_1a8,pIVar7[lVar11].out_opcode_ & 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," in Prog::Fanout()",0x12);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      _Var3._M_head_impl =
           local_1e0.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>
           ._M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
    case 7:
switchD_011d2f0c_caseD_7:
      _Var12._M_head_impl = _Var12._M_head_impl + 1;
      puVar8 = (uint *)_Var3._M_head_impl + local_1e0.size_;
      if ((uint *)_Var12._M_head_impl == puVar8) {
        pIVar6 = (fanout->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                 _M_head_impl;
        _Var12._M_head_impl = _Var3._M_head_impl;
        goto LAB_011d3131;
      }
      break;
    case 2:
switchD_011d2f0c_caseD_2:
      if (((((uVar9 & 8) == 0) && (puVar5 != (uint *)0x0)) &&
          (uVar10 = (int)lVar11 + 1,
          uVar10 < (uint)local_1e0.dense_.ptr_._M_t.
                         super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>.
                         _M_head_impl.len_)) &&
         (((uint)local_1e0.size_ <=
           (uint)local_1e0.sparse_.ptr_._M_t.
                 super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11 + 1] ||
          (puVar5[local_1e0.sparse_.ptr_._M_t.
                  super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11 + 1]] != uVar10)))) {
        local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11 + 1] = local_1e0.size_;
        *puVar8 = uVar10;
        local_1e0.size_ = local_1e0.size_ + 1;
      }
      local_1b8->value_ = local_1b8->value_ + 1;
      pIVar6 = (fanout->dense_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
               _M_head_impl;
      if (pIVar6 != (IndexValue *)0x0) {
        _Var4._M_head_impl.len_ = (Deleter)(pIVar7[lVar11].out_opcode_ >> 4);
        if ((uint)_Var4._M_head_impl.len_ <
            (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
           ) {
          piVar1 = (fanout->sparse_).ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          uVar10 = fanout->size_;
          if ((uVar10 <= (uint)piVar1[(uint)_Var4._M_head_impl.len_]) ||
             ((Deleter)pIVar6[piVar1[(uint)_Var4._M_head_impl.len_]].index_ !=
              _Var4._M_head_impl.len_)) {
            piVar1[(uint)_Var4._M_head_impl.len_] = uVar10;
            pIVar6[(int)uVar10].index_ = (int)_Var4._M_head_impl.len_;
            fanout->size_ = uVar10 + 1;
            pIVar6[piVar1[(uint)_Var4._M_head_impl.len_]].value_ = 0;
          }
        }
      }
      goto switchD_011d2f0c_caseD_7;
    default:
switchD_011d2f0c_caseD_3:
      if (((((uVar9 & 8) == 0) && (puVar5 != (uint *)0x0)) &&
          (uVar10 = (int)lVar11 + 1,
          uVar10 < (uint)local_1e0.dense_.ptr_._M_t.
                         super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>.
                         _M_head_impl.len_)) &&
         (((uint)local_1e0.size_ <=
           (uint)local_1e0.sparse_.ptr_._M_t.
                 super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11 + 1] ||
          (puVar5[local_1e0.sparse_.ptr_._M_t.
                  super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11 + 1]] != uVar10)))) {
        local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11 + 1] = local_1e0.size_;
        *puVar8 = uVar10;
        local_1e0.size_ = local_1e0.size_ + 1;
        uVar9 = pIVar7[lVar11].out_opcode_;
      }
      if ((puVar5 != (uint *)0x0) &&
         (uVar9 = uVar9 >> 4,
         uVar9 < (uint)local_1e0.dense_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>._M_head_impl
                       .len_)) {
        if (((uint)local_1e0.size_ <=
             (uint)local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar9]) ||
           (puVar5[local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar9]] != uVar9)) {
          local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>
          ._M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar9] = local_1e0.size_;
          puVar5[local_1e0.size_] = uVar9;
          goto LAB_011d3121;
        }
      }
      goto switchD_011d2f0c_caseD_7;
    case 5:
switchD_011d2f0c_caseD_5:
      if ((uVar9 & 8) != 0) goto switchD_011d2f0c_caseD_7;
    case 1:
switchD_011d2f0c_caseD_1:
      if ((puVar5 != (uint *)0x0) &&
         (uVar10 = uVar10 + 1,
         uVar10 < (uint)local_1e0.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                        super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                        super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>.
                        _M_head_impl.len_)) {
        if (((uint)local_1e0.size_ <=
             (uint)local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar10]) ||
           (puVar5[local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar10]] != uVar10)) {
          local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>
          ._M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar10] = local_1e0.size_;
          *puVar8 = uVar10;
LAB_011d3121:
          local_1e0.size_ = local_1e0.size_ + 1;
        }
      }
      goto switchD_011d2f0c_caseD_7;
    }
  } while( true );
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->value();
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}